

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O1

void duckdb::CountFunction::CountScatter
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,Vector *states,
               idx_t count)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  idx_t iVar12;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_a8;
  UnifiedVectorFormat local_60;
  
  if (states->vector_type == FLAT_VECTOR && inputs->vector_type == FLAT_VECTOR) {
    pdVar1 = states->data;
    FlatVector::VerifyFlatVector(inputs);
    puVar2 = (inputs->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 == (unsigned_long *)0x0) {
      if (count != 0) {
        iVar6 = 0;
        do {
          **(long **)(pdVar1 + iVar6 * 8) = **(long **)(pdVar1 + iVar6 * 8) + 1;
          iVar6 = iVar6 + 1;
        } while (count != iVar6);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar9 = 0;
      uVar8 = 0;
      do {
        uVar3 = puVar2[uVar9];
        uVar10 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar10 = count;
        }
        uVar7 = uVar10;
        if (uVar3 != 0) {
          uVar7 = uVar8;
          if (uVar3 == 0xffffffffffffffff) {
            if (uVar8 < uVar10) {
              do {
                **(long **)(pdVar1 + uVar7 * 8) = **(long **)(pdVar1 + uVar7 * 8) + 1;
                uVar7 = uVar7 + 1;
              } while (uVar10 != uVar7);
            }
          }
          else if (uVar8 < uVar10) {
            uVar7 = 0;
            do {
              if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
                **(long **)(pdVar1 + uVar7 * 8 + uVar8 * 8) =
                     **(long **)(pdVar1 + uVar7 * 8 + uVar8 * 8) + 1;
              }
              uVar7 = uVar7 + 1;
            } while ((uVar8 - uVar10) + uVar7 != 0);
            uVar7 = uVar8 + uVar7;
          }
        }
        uVar9 = uVar9 + 1;
        uVar8 = uVar7;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_60);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_a8);
    Vector::ToUnifiedFormat(inputs,count,&local_60);
    Vector::ToUnifiedFormat(states,count,&local_a8);
    if (local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_a8.sel)->sel_vector;
        uVar8 = 0;
        do {
          uVar9 = uVar8;
          if (psVar4 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar4[uVar8];
          }
          **(long **)(local_a8.data + uVar9 * 8) = **(long **)(local_a8.data + uVar9 * 8) + 1;
          uVar8 = uVar8 + 1;
        } while (count != uVar8);
      }
    }
    else if (count != 0) {
      psVar4 = (local_60.sel)->sel_vector;
      psVar5 = (local_a8.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar11 = iVar6;
        if (psVar4 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar4[iVar6];
        }
        iVar12 = iVar6;
        if (psVar5 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar5[iVar6];
        }
        if ((local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6]
             >> (iVar11 & 0x3f) & 1) != 0) {
          **(long **)(local_a8.data + iVar12 * 8) = **(long **)(local_a8.data + iVar12 * 8) + 1;
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    if (local_a8.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_60.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void CountScatter(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, Vector &states,
	                         idx_t count) {
		auto &input = inputs[0];
		if (input.GetVectorType() == VectorType::FLAT_VECTOR && states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto sdata = FlatVector::GetData<STATE *>(states);
			CountFlatLoop(sdata, FlatVector::Validity(input), count);
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			CountScatterLoop(reinterpret_cast<STATE **>(sdata.data), *idata.sel, *sdata.sel, idata.validity, count);
		}
	}